

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

ArrayNewFixed * __thiscall MixedArena::alloc<wasm::ArrayNewFixed>(MixedArena *this)

{
  ArrayNewFixed *pAVar1;
  
  pAVar1 = (ArrayNewFixed *)allocSpace(this,0x30,8);
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression._id =
       ArrayNewFixedId;
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression.type.id = 0;
  (pAVar1->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data =
       (Expression **)0x0;
  (pAVar1->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pAVar1->values).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pAVar1->values).allocator = this;
  return pAVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }